

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O0

bool __thiscall ReleaseSite::CheckInteraction(ReleaseSite *this,string *name,int reading_frame)

{
  size_type sVar1;
  int reading_frame_local;
  string *name_local;
  ReleaseSite *this_local;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          ::count(&(this->super_FixedElement).interactions_,name);
  if (sVar1 == 1) {
    if ((this->super_FixedElement).reading_frame_ == -1) {
      return true;
    }
    if (reading_frame == (this->super_FixedElement).reading_frame_) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ReleaseSite::CheckInteraction(const std::string &name, int reading_frame) {
  if (interactions_.count(name) == 1) {
    if (reading_frame_ == -1) {
      return true;
    }
    if (reading_frame == reading_frame_) {
      return true;
    }
  }
  return false;
}